

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::Buffer<wchar_t>::append<wchar_t>(Buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  ulong uVar1;
  
  uVar1 = ((long)end - (long)begin >> 2) + *(long *)(this + 0x10);
  if (*(ulong *)(this + 0x18) < uVar1) {
    (*(code *)**(undefined8 **)this)(this,uVar1);
  }
  if (end != begin) {
    memmove((void *)(*(long *)(this + 0x10) * 4 + *(long *)(this + 8)),begin,(long)end - (long)begin
           );
  }
  *(ulong *)(this + 0x10) = uVar1;
  return;
}

Assistant:

void Buffer<T>::append(const U *begin, const U *end) {
  std::size_t new_size = size_ + internal::to_unsigned(end - begin);
  if (new_size > capacity_)
    grow(new_size);
  std::uninitialized_copy(begin, end,
                          internal::make_ptr(ptr_, capacity_) + size_);
  size_ = new_size;
}